

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_trap_t * wasm_func_call(wasm_func_t *f,wasm_val_vec_t *args,wasm_val_vec_t *results)

{
  Result RVar1;
  Func *pFVar2;
  Func *this;
  wasm_trap_t *this_00;
  Ptr trap;
  Values wabt_results;
  Values wabt_args;
  RefPtr<wabt::interp::Trap> local_48;
  
  pFVar2 = wasm_ref_t::As<wabt::interp::Func>((wasm_ref_t *)f);
  ToWabtValues(&wabt_args,args);
  wabt_results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  wabt_results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  wabt_results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trap.obj_ = (Trap *)0x0;
  trap.store_ = (Store *)0x0;
  trap.root_index_ = 0;
  this = wasm_ref_t::As<wabt::interp::Func>((wasm_ref_t *)f);
  RVar1 = wabt::interp::Func::Call
                    (this,(f->super_wasm_extern_t).super_wasm_ref_t.I.store_,&wabt_args,
                     &wabt_results,&trap,(Stream *)0x0);
  if (RVar1.enum_ == Error) {
    this_00 = (wasm_trap_t *)operator_new(0x18);
    wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr(&local_48,&trap);
    wasm_trap_t::wasm_trap_t(this_00,&local_48);
    wabt::interp::RefPtr<wabt::interp::Trap>::reset(&local_48);
  }
  else {
    FromWabtValues((f->super_wasm_extern_t).super_wasm_ref_t.I.store_,results,
                   &(pFVar2->type_).results,&wabt_results);
    this_00 = (wasm_trap_t *)0x0;
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&wabt_results.
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&wabt_args.
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
  return this_00;
}

Assistant:

own wasm_trap_t* wasm_func_call(const wasm_func_t* f,
                                const wasm_val_vec_t* args,
                                wasm_val_vec_t* results) {
  // TODO: get some information about the function; name/index
  // TRACE("%d", f->index);

  auto&& func_type = f->As<Func>()->type();
  Values wabt_args = ToWabtValues(args);
  Values wabt_results;
  Trap::Ptr trap;
  if (Failed(
          f->As<Func>()->Call(*f->I.store(), wabt_args, wabt_results, &trap))) {
    return new wasm_trap_t{trap};
  }
  FromWabtValues(*f->I.store(), results, func_type.results, wabt_results);
  return nullptr;
}